

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O3

BuildValue * __thiscall
llbuild::buildsystem::ExternalCommand::getResultForOutput
          (BuildValue *__return_storage_ptr__,ExternalCommand *this,Node *node,BuildValue *value)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  bool bVar8;
  __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
  _Var9;
  long lVar10;
  FileInfo *this_00;
  Node *local_20;
  
  local_20 = node;
  switch(value->kind) {
  case SuccessfulCommand:
  case SuccessfulCommandWithOutputSignature:
    if ((*(char *)&node[1]._vptr_Node == '\x03') &&
       (*(char *)((long)&node[1]._vptr_Node + 1) == '\0')) {
      __return_storage_ptr__->kind = VirtualInput;
    }
    else {
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<llbuild::buildsystem::BuildNode**,std::vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<llbuild::buildsystem::Node*const>>
                        ((this->super_Command).outputs.
                         super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->super_Command).outputs.
                         super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_20);
      if (_Var9._M_current ==
          (this->super_Command).outputs.
          super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("it != outputs.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                      ,0x9c,
                      "virtual BuildValue llbuild::buildsystem::ExternalCommand::getResultForOutput(Node *, const BuildValue &)"
                     );
      }
      if ((SuccessfulCommandWithOutputSignature < value->kind) ||
         ((0x20414U >> (value->kind & (FilteredDirectoryContents|Target)) & 1) == 0)) {
        __assert_fail("kindHasOutputInfo() && \"invalid call for value kind\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                      ,0x186,"unsigned int llbuild::buildsystem::BuildValue::getNumOutputs() const")
        ;
      }
      lVar10 = (long)_Var9._M_current -
               (long)(this->super_Command).outputs.
                     super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      if ((long)(ulong)value->numOutputInfos <= lVar10) {
        __assert_fail("idx < static_cast<ssize_t>(value.getNumOutputs())",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                      ,0x9f,
                      "virtual BuildValue llbuild::buildsystem::ExternalCommand::getResultForOutput(Node *, const BuildValue &)"
                     );
      }
      this_00 = BuildValue::getNthOutputInfo(value,(uint)lVar10);
      bVar8 = llbuild::basic::FileInfo::isMissing(this_00);
      if (!bVar8) {
        uVar1 = this_00->device;
        uVar2 = this_00->inode;
        uVar3 = this_00->mode;
        uVar4 = this_00->size;
        uVar5 = (this_00->modTime).seconds;
        uVar6 = (this_00->modTime).nanoseconds;
        if ((((uVar1 == 0) && (uVar2 == 0)) && (uVar3 == 0)) &&
           (((uVar4 == 0 && (uVar5 == 0)) && (uVar6 == 0)))) {
          __assert_fail("!outputInfo.isMissing()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                        ,0x113,
                        "static BuildValue llbuild::buildsystem::BuildValue::makeExistingInput(FileInfo)"
                       );
        }
        __return_storage_ptr__->kind = ExistingInput;
        __return_storage_ptr__->numOutputInfos = 1;
        (__return_storage_ptr__->signature).value = 0;
        (__return_storage_ptr__->valueData).asOutputInfo.device = 0;
        (__return_storage_ptr__->valueData).asOutputInfo.inode = 0;
        (__return_storage_ptr__->valueData).asOutputInfo.mode = 0;
        (__return_storage_ptr__->valueData).asOutputInfo.size = 0;
        (__return_storage_ptr__->valueData).asOutputInfo.modTime.seconds = 0;
        (__return_storage_ptr__->valueData).asOutputInfo.modTime.nanoseconds = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x30) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x48) = 0;
        (__return_storage_ptr__->stringValues).contents = (char *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x38) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x40) = 0;
        (__return_storage_ptr__->stringValues).size = 0;
        (__return_storage_ptr__->valueData).asOutputInfo.device = uVar1;
        (__return_storage_ptr__->valueData).asOutputInfo.inode = uVar2;
        (__return_storage_ptr__->valueData).asOutputInfo.mode = uVar3;
        (__return_storage_ptr__->valueData).asOutputInfo.size = uVar4;
        (__return_storage_ptr__->valueData).asOutputInfo.modTime.seconds = uVar5;
        (__return_storage_ptr__->valueData).asOutputInfo.modTime.nanoseconds = uVar6;
        uVar7 = *(undefined8 *)((this_00->checksum).bytes + 8);
        *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x30) =
             *(undefined8 *)(this_00->checksum).bytes;
        *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x38) = uVar7;
        uVar7 = *(undefined8 *)((this_00->checksum).bytes + 0x18);
        *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x40) =
             *(undefined8 *)((this_00->checksum).bytes + 0x10);
        *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x48) = uVar7;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->kind = MissingOutput;
    }
    break;
  case FailedCommand:
  case PropagatedFailureCommand:
  case CancelledCommand:
    __return_storage_ptr__->kind = FailedInput;
    break;
  case SkippedCommand:
    __return_storage_ptr__->kind = SkippedCommand;
    break;
  default:
    __assert_fail("value.isSuccessfulCommand()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                  ,0x8c,
                  "virtual BuildValue llbuild::buildsystem::ExternalCommand::getResultForOutput(Node *, const BuildValue &)"
                 );
  }
  *(undefined8 *)&__return_storage_ptr__->numOutputInfos = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->signature).value + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.device + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.inode + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.mode + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.size + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.modTime.seconds + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.modTime.nanoseconds + 4) =
       0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x34) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x3c) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x44) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x4c) = 0;
  (__return_storage_ptr__->stringValues).contents = (char *)0x0;
  (__return_storage_ptr__->stringValues).size = 0;
  return __return_storage_ptr__;
}

Assistant:

BuildValue ExternalCommand::
getResultForOutput(Node* node, const BuildValue& value) {
  // If the value was a failed or cancelled command, propagate the failure.
  if (value.isFailedCommand() || value.isPropagatedFailureCommand() ||
      value.isCancelledCommand())
    return BuildValue::makeFailedInput();
  if (value.isSkippedCommand())
      return BuildValue::makeSkippedCommand();

  // Otherwise, we should have a successful command -- return the actual
  // result for the output.
  assert(value.isSuccessfulCommand());

  // If the node is virtual, the output is always a virtual input value.
  //
  // FIXME: Eliminate this, and make the build value array contain an array of
  // build values.
  auto buildNode = static_cast<BuildNode*>(node);
  if (buildNode->isVirtual() && !buildNode->isCommandTimestamp()) {
    return BuildValue::makeVirtualInput();
  }
    
  // Find the index of the output node.
  //
  // FIXME: This is O(N). We don't expect N to be large in practice, but it
  // could be.
  auto it = std::find(outputs.begin(), outputs.end(), node);
  assert(it != outputs.end());
    
  auto idx = it - outputs.begin();
  assert(idx < static_cast<ssize_t>(value.getNumOutputs()));

  auto& info = value.getNthOutputInfo(idx);
  if (info.isMissing())
    return BuildValue::makeMissingOutput();
    
  return BuildValue::makeExistingInput(info);
}